

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Write.cpp
# Opt level: O0

void idx2::WriteChunk(idx2_file *Idx2,encode_data *E,channel *C,i8 Level,i8 Subband,i16 BitPlane)

{
  allocator **ppaVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  size_t sVar5;
  buffer *Src;
  ulong uVar6;
  bitstream *Src_00;
  anon_class_8_1_3fcf61a8_for_Func Key;
  stref sVar7;
  byte local_6f9;
  double local_660;
  double local_658;
  double local_5f8;
  double local_5f0;
  double local_5d8;
  double local_5d0;
  long local_5a0;
  u64 ChunkAddress;
  chunk_meta_info *ChunkMeta;
  chunk_meta_info Cm;
  iterator ChunkMetaIt;
  anon_union_8_2_2df48d06_for_stref_0 local_4d8;
  undefined4 local_4d0;
  anon_union_8_2_2df48d06_for_stref_0 local_4c8;
  int local_4c0;
  undefined1 local_4b8 [8];
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Write_cpp:272:3)>
  __ScopeGuard__272;
  anon_class_8_1_3fcf61a8_for_Func __CleanUpFunc__272;
  FILE *Fp;
  file_id FileId;
  i64 ChunkSize;
  i16 BitPlane_local;
  i8 Subband_local;
  i8 Level_local;
  channel *C_local;
  encode_data *E_local;
  idx2_file *Idx2_local;
  int BytePos_2;
  double local_448;
  double *local_440;
  double local_438;
  double *local_430;
  double local_428;
  double *local_420;
  bitstream *local_418;
  bitstream *local_410;
  bitstream *local_408;
  bitstream *local_400;
  channel *local_3f8;
  bitstream *local_3f0;
  channel *local_3e8;
  bitstream *local_3e0;
  bitstream *local_3d8;
  bitstream *local_3d0;
  channel *local_3c8;
  bitstream *local_3c0;
  bitstream *local_3b8;
  bitstream *local_3b0;
  mallocator *local_3a8;
  undefined8 local_3a0;
  allocator **local_398;
  unsigned_long local_390;
  i64 NewCapacity_1;
  i64 OriginalCapacity_1;
  buffer *local_378;
  buffer *local_370;
  long local_368;
  i64 NewCapacity;
  i64 OriginalCapacity;
  bitstream *local_350;
  bitstream *local_348;
  int local_33c;
  byte *pbStack_338;
  int BytesWritten_1;
  long local_330;
  int local_324;
  ulong uStack_320;
  int BytesWritten;
  bitstream *local_318;
  i16 local_30c;
  i8 local_30a;
  i8 local_309;
  ulong local_308;
  idx2_file *local_300;
  long *local_2f8;
  long *local_2f0;
  FILE *local_2e8;
  anon_union_8_2_2df48d06_for_stref_0 *local_2e0;
  i64 *local_2d8;
  FILE **local_2d0;
  i64 *local_2c8;
  bitstream *local_2c0;
  buffer *local_2b8;
  int *local_2b0;
  double *local_2a8;
  double *local_2a0;
  double *local_298;
  double *local_290;
  double *local_288;
  double *local_280;
  double *local_278;
  double *local_270;
  double *local_268;
  double *local_260;
  double *local_258;
  double *local_250;
  allocator *local_248;
  byte *local_240;
  byte *local_238;
  i64 *local_230;
  undefined1 local_228 [8];
  buffer NewBuf;
  undefined1 local_1e0 [8];
  buffer NewBuf_1;
  int BytePos_1;
  int BytePos;
  int BytePos_4;
  int BytePos_3;
  i8 I;
  
  local_428 = (double)(long)((C->BrickDeltasStream).BitPtr +
                            ((long)(((C->BrickDeltasStream).BitPos + 7) / 8) -
                            (long)(C->BrickDeltasStream).Stream.Data));
  local_420 = &BrickDeltasStat;
  local_2a0 = &BrickDeltasStat;
  local_2a8 = &local_428;
  local_5d0 = local_428;
  if (BrickDeltasStat <= local_428) {
    local_5d0 = BrickDeltasStat;
  }
  BrickDeltasStat = local_5d0;
  local_270 = &DAT_00300530;
  local_278 = &local_428;
  local_5d8 = local_428;
  if (local_428 <= DAT_00300530) {
    local_5d8 = DAT_00300530;
  }
  DAT_00300530 = local_5d8;
  DAT_00300538 = local_428 + DAT_00300538;
  DAT_00300540 = DAT_00300540 + 1;
  DAT_00300548 = local_428 * local_428 + DAT_00300548;
  local_3f0 = &C->BrickSizeStream;
  local_438 = (double)(long)((C->BrickSizeStream).BitPtr +
                            ((long)(((C->BrickSizeStream).BitPos + 7) / 8) -
                            (long)(local_3f0->Stream).Data));
  local_430 = &BrickSizesStat;
  local_290 = &BrickSizesStat;
  local_298 = &local_438;
  local_5f0 = local_438;
  if (BrickSizesStat <= local_438) {
    local_5f0 = BrickSizesStat;
  }
  BrickSizesStat = local_5f0;
  local_260 = &DAT_00300558;
  local_268 = &local_438;
  local_5f8 = local_438;
  if (local_438 <= DAT_00300558) {
    local_5f8 = DAT_00300558;
  }
  DAT_00300558 = local_5f8;
  DAT_00300560 = local_438 + DAT_00300560;
  DAT_00300568 = DAT_00300568 + 1;
  DAT_00300570 = local_438 * local_438 + DAT_00300570;
  local_400 = &C->BrickSizeStream;
  local_408 = &C->BrickStream;
  FileId.Id = (u64)((C->BrickDeltasStream).BitPtr +
                   (long)((C->BrickSizeStream).BitPtr +
                         (long)((C->BrickStream).BitPtr +
                               ((long)(((C->BrickDeltasStream).BitPos + 7) / 8) -
                               (long)(C->BrickDeltasStream).Stream.Data) +
                               ((long)(((C->BrickSizeStream).BitPos + 7) / 8) -
                               (long)(local_400->Stream).Data) +
                               ((long)(((C->BrickStream).BitPos + 7) / 8) -
                               (long)(local_408->Stream).Data) + 0x40)));
  local_3c0 = &E->ChunkStream;
  (E->ChunkStream).BitPtr = (local_3c0->Stream).Data;
  (E->ChunkStream).BitPos = 0;
  (E->ChunkStream).BitBuf = 0;
  Src_00 = &E->ChunkStream;
  NewCapacity = (E->ChunkStream).Stream.Bytes;
  for (local_368 = NewCapacity;
      local_368 <=
      (long)((E->ChunkStream).BitPtr +
            (long)(FileId.Id +
                  ((long)(((E->ChunkStream).BitPos + 7) / 8) - (long)(Src_00->Stream).Data) + 8));
      local_368 = (local_368 * 3) / 2 + 8) {
  }
  local_3f8 = C;
  local_3e8 = C;
  OriginalCapacity = FileId.Id;
  local_350 = Src_00;
  local_348 = Src_00;
  local_2c0 = Src_00;
  if ((NewCapacity < local_368) &&
     (NewBuf.Alloc = (allocator *)(local_368 + 8),
     (E->ChunkStream).Stream.Bytes < (long)NewBuf.Alloc)) {
    NewBuf.Bytes = (i64)Mallocator();
    local_228 = (undefined1  [8])0x0;
    NewBuf.Data = (byte *)0x0;
    AllocBuf((buffer *)local_228,(i64)NewBuf.Alloc,(E->ChunkStream).Stream.Alloc);
    MemCopy(&Src_00->Stream,(buffer *)local_228,
            (u64)((E->ChunkStream).BitPtr +
                 ((long)(((E->ChunkStream).BitPos + 7) / 8) - (long)(Src_00->Stream).Data)));
    (E->ChunkStream).BitPtr =
         (byte *)((long)local_228 + ((long)(E->ChunkStream).BitPtr - (long)(Src_00->Stream).Data));
    DeallocBuf(&Src_00->Stream);
    (Src_00->Stream).Data = (byte *)local_228;
    (E->ChunkStream).Stream.Bytes = (i64)NewBuf.Data;
    (E->ChunkStream).Stream.Alloc = (allocator *)NewBuf.Bytes;
  }
  local_318 = &E->ChunkStream;
  uStack_320 = (ulong)C->NBricks;
  local_324 = 0;
  do {
    local_324 = local_324 + 1;
    if (local_324 == 0) break;
    if (0x3f < (E->ChunkStream).BitPos + 7) {
      *(u64 *)(E->ChunkStream).BitPtr = (E->ChunkStream).BitBuf;
      iVar4 = (E->ChunkStream).BitPos >> 3;
      if (0 < iVar4) {
        (E->ChunkStream).BitBuf = ((E->ChunkStream).BitBuf >> 1) >> ((char)(iVar4 << 3) - 1U & 0x3f)
        ;
      }
      (E->ChunkStream).BitPtr = (E->ChunkStream).BitPtr + iVar4;
      (E->ChunkStream).BitPos = (E->ChunkStream).BitPos & 7;
    }
    (E->ChunkStream).BitBuf =
         (uStack_320 & 0x7f & bitstream::Masks.Arr[7]) << ((byte)(E->ChunkStream).BitPos & 0x3f) |
         (E->ChunkStream).BitBuf;
    (E->ChunkStream).BitPos = (E->ChunkStream).BitPos + 7;
    uStack_320 = uStack_320 >> 7;
    if (0x3f < (E->ChunkStream).BitPos + 1) {
      *(u64 *)(E->ChunkStream).BitPtr = (E->ChunkStream).BitBuf;
      iVar4 = (E->ChunkStream).BitPos >> 3;
      if (0 < iVar4) {
        (E->ChunkStream).BitBuf = ((E->ChunkStream).BitBuf >> 1) >> ((char)(iVar4 << 3) - 1U & 0x3f)
        ;
      }
      (E->ChunkStream).BitPtr = (E->ChunkStream).BitPtr + iVar4;
      (E->ChunkStream).BitPos = (E->ChunkStream).BitPos & 7;
    }
    (E->ChunkStream).BitBuf =
         (uStack_320 != 0 & bitstream::Masks.Arr[1]) << ((byte)(E->ChunkStream).BitPos & 0x3f) |
         (E->ChunkStream).BitBuf;
    (E->ChunkStream).BitPos = (E->ChunkStream).BitPos + 1;
  } while (uStack_320 != 0);
  WriteStream(&E->ChunkStream,&C->BrickDeltasStream);
  WriteStream(&E->ChunkStream,&C->BrickSizeStream);
  WriteStream(&E->ChunkStream,&C->BrickStream);
  *(u64 *)(E->ChunkStream).BitPtr = (E->ChunkStream).BitBuf;
  iVar4 = (E->ChunkStream).BitPos >> 3;
  if (0 < iVar4) {
    (E->ChunkStream).BitBuf = ((E->ChunkStream).BitBuf >> 1) >> ((char)(iVar4 << 3) - 1U & 0x3f);
  }
  (E->ChunkStream).BitPtr = (E->ChunkStream).BitPtr + iVar4;
  (E->ChunkStream).BitPos = (E->ChunkStream).BitPos & 7;
  local_410 = &E->ChunkStream;
  local_448 = (double)(long)((E->ChunkStream).BitPtr +
                            ((long)(((E->ChunkStream).BitPos + 7) / 8) -
                            (long)(local_410->Stream).Data));
  local_440 = &BitPlaneChunksStat;
  local_280 = &BitPlaneChunksStat;
  local_288 = &local_448;
  local_658 = local_448;
  if (BitPlaneChunksStat <= local_448) {
    local_658 = BitPlaneChunksStat;
  }
  BitPlaneChunksStat = local_658;
  local_250 = &DAT_00300580;
  local_258 = &local_448;
  local_660 = local_448;
  if (local_448 <= DAT_00300580) {
    local_660 = DAT_00300580;
  }
  DAT_00300580 = local_660;
  DAT_00300588 = local_448 + DAT_00300588;
  DAT_00300590 = DAT_00300590 + 1;
  DAT_00300598 = local_448 * local_448 + DAT_00300598;
  (C->BrickDeltasStream).BitPtr = (C->BrickDeltasStream).Stream.Data;
  (C->BrickDeltasStream).BitPos = 0;
  (C->BrickDeltasStream).BitBuf = 0;
  local_3d0 = &C->BrickSizeStream;
  (C->BrickSizeStream).BitPtr = (local_3d0->Stream).Data;
  (C->BrickSizeStream).BitPos = 0;
  (C->BrickSizeStream).BitBuf = 0;
  local_3d8 = &C->BrickStream;
  (C->BrickStream).BitPtr = (local_3d8->Stream).Data;
  (C->BrickStream).BitPos = 0;
  (C->BrickStream).BitBuf = 0;
  local_3c8 = C;
  ConstructFilePath((file_id *)&Fp,Idx2,C->LastBrick,Level,Subband,BitPlane);
  __CleanUpFunc__272.Fp = (FILE **)fopen((char *)Fp,"ab");
  __ScopeGuard__272._8_8_ = &__CleanUpFunc__272;
  scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Write.cpp:272:3)>
  ::scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Write_cpp:272:3)>
                 *)local_4b8,(anon_class_8_1_3fcf61a8_for_Func *)&__ScopeGuard__272.Dismissed);
  if (__CleanUpFunc__272.Fp == (FILE **)0x0) {
    local_2e0 = &local_4d8;
    local_2e8 = Fp;
    local_4d8.Ptr = (str)Fp;
    sVar5 = strlen((char *)Fp);
    local_4d0 = (undefined4)sVar5;
    sVar7 = GetParentPath((stref *)&local_4d8);
    local_4c8 = sVar7.field_0;
    local_4c0 = sVar7.Size;
    CreateFullDir((stref *)&local_4c8);
    __CleanUpFunc__272.Fp = (FILE **)fopen((char *)Fp,"ab");
  }
  local_3b8 = &E->ChunkStream;
  local_238 = (local_3b8->Stream).Data;
  local_240 = (E->ChunkStream).BitPtr +
              ((long)(((E->ChunkStream).BitPos + 7) / 8) - (long)(local_3b8->Stream).Data);
  local_248 = (E->ChunkStream).Stream.Alloc;
  local_230 = &ChunkMetaIt.Idx;
  local_2d0 = __CleanUpFunc__272.Fp;
  local_2d8 = &ChunkMetaIt.Idx;
  Key.Fp = __CleanUpFunc__272.Fp;
  local_3b0 = local_3b8;
  local_2c8 = local_2d8;
  ChunkMetaIt.Idx = (i64)local_238;
  fwrite(local_238,(size_t)local_240,1,(FILE *)__CleanUpFunc__272.Fp);
  Lookup<unsigned_long,idx2::chunk_meta_info>
            ((iterator *)&Cm.Sizes.BitPos,(idx2 *)&E->ChunkMeta,
             (hash_table<unsigned_long,_idx2::chunk_meta_info> *)&FileId.Name.Size,
             (unsigned_long *)Key.Fp);
  local_2b0 = &Cm.Sizes.BitPos;
  if (*(char *)((long)&(ChunkMetaIt.Ht)->Keys +
               (long)&(((ChunkMetaIt.Val)->Addrs).Buffer.Alloc)->_vptr_allocator) != '\x02') {
    chunk_meta_info::chunk_meta_info((chunk_meta_info *)&ChunkMeta);
    ppaVar1 = &Cm.Addrs.Alloc;
    local_3a8 = Mallocator();
    local_3a0 = 0x80;
    local_398 = ppaVar1;
    (**(local_3a8->super_allocator)._vptr_allocator)(local_3a8,ppaVar1,0x88);
    local_398[3] = *local_398;
    *(undefined4 *)(local_398 + 5) = 0;
    local_398[4] = (allocator *)0x0;
    Insert<unsigned_long,idx2::chunk_meta_info>
              ((iterator *)&Cm.Sizes.BitPos,(unsigned_long *)&FileId.Name.Size,
               (chunk_meta_info *)&ChunkMeta);
  }
  ChunkAddress = (u64)ChunkMetaIt.Key;
  Src = (buffer *)(ChunkMetaIt.Key + 6);
  OriginalCapacity_1 = 4;
  NewCapacity_1 = ChunkMetaIt.Key[7];
  for (local_390 = NewCapacity_1;
      (long)local_390 <=
      (long)((ChunkMetaIt.Key[9] - (long)Src->Data) + (long)(((int)ChunkMetaIt.Key[0xb] + 7) / 8) +
            0xc); local_390 = (long)(local_390 * 3) / 2 + 8) {
  }
  local_378 = Src;
  local_370 = Src;
  local_2b8 = Src;
  if ((NewCapacity_1 < (long)local_390) &&
     (NewBuf_1.Alloc = (allocator *)(local_390 + 8), (long)ChunkMetaIt.Key[7] < (long)NewBuf_1.Alloc
     )) {
    NewBuf_1.Bytes = (i64)Mallocator();
    local_1e0 = (undefined1  [8])0x0;
    NewBuf_1.Data = (byte *)0x0;
    AllocBuf((buffer *)local_1e0,(i64)NewBuf_1.Alloc,(allocator *)ChunkMetaIt.Key[8]);
    iVar4 = (int)ChunkMetaIt.Key[0xb] + 7;
    if (iVar4 < 0) {
      iVar4 = (int)ChunkMetaIt.Key[0xb] + 0xe;
    }
    MemCopy(Src,(buffer *)local_1e0,(ChunkMetaIt.Key[9] - (long)Src->Data) + (long)(iVar4 >> 3));
    ChunkMetaIt.Key[9] = (unsigned_long)((long)local_1e0 + (ChunkMetaIt.Key[9] - (long)Src->Data));
    DeallocBuf(Src);
    Src->Data = (byte *)local_1e0;
    ChunkMetaIt.Key[7] = (unsigned_long)NewBuf_1.Data;
    ChunkMetaIt.Key[8] = NewBuf_1.Bytes;
  }
  local_330 = ChunkAddress + 0x30;
  local_418 = &E->ChunkStream;
  pbStack_338 = (E->ChunkStream).BitPtr +
                ((long)(((E->ChunkStream).BitPos + 7) / 8) - (long)(local_418->Stream).Data);
  local_33c = 0;
  do {
    local_33c = local_33c + 1;
    if (local_33c == 0) break;
    if (0x3f < *(int *)(ChunkAddress + 0x58) + 7) {
      **(undefined8 **)(ChunkAddress + 0x48) = *(undefined8 *)(ChunkAddress + 0x50);
      iVar4 = *(int *)(ChunkAddress + 0x58) >> 3;
      if (0 < iVar4) {
        *(ulong *)(ChunkAddress + 0x50) =
             (*(ulong *)(ChunkAddress + 0x50) >> 1) >> ((char)(iVar4 << 3) - 1U & 0x3f);
      }
      *(long *)(ChunkAddress + 0x48) = *(long *)(ChunkAddress + 0x48) + (long)iVar4;
      *(uint *)(ChunkAddress + 0x58) = *(uint *)(ChunkAddress + 0x58) & 7;
    }
    *(ulong *)(ChunkAddress + 0x50) =
         ((ulong)pbStack_338 & 0x7f & bitstream::Masks.Arr[7]) <<
         ((byte)*(undefined4 *)(ChunkAddress + 0x58) & 0x3f) | *(ulong *)(ChunkAddress + 0x50);
    *(int *)(ChunkAddress + 0x58) = *(int *)(ChunkAddress + 0x58) + 7;
    pbStack_338 = (byte *)((ulong)pbStack_338 >> 7);
    if (0x3f < *(int *)(ChunkAddress + 0x58) + 1) {
      **(undefined8 **)(ChunkAddress + 0x48) = *(undefined8 *)(ChunkAddress + 0x50);
      iVar4 = *(int *)(ChunkAddress + 0x58) >> 3;
      if (0 < iVar4) {
        *(ulong *)(ChunkAddress + 0x50) =
             (*(ulong *)(ChunkAddress + 0x50) >> 1) >> ((char)(iVar4 << 3) - 1U & 0x3f);
      }
      *(long *)(ChunkAddress + 0x48) = *(long *)(ChunkAddress + 0x48) + (long)iVar4;
      *(uint *)(ChunkAddress + 0x58) = *(uint *)(ChunkAddress + 0x58) & 7;
    }
    *(ulong *)(ChunkAddress + 0x50) =
         (pbStack_338 != (byte *)0x0 & bitstream::Masks.Arr[1]) <<
         ((byte)*(undefined4 *)(ChunkAddress + 0x58) & 0x3f) | *(ulong *)(ChunkAddress + 0x50);
    *(int *)(ChunkAddress + 0x58) = *(int *)(ChunkAddress + 0x58) + 1;
  } while (pbStack_338 != (byte *)0x0);
  local_308 = C->LastBrick;
  local_30c = BitPlane;
  local_30a = Subband;
  local_309 = Level;
  local_300 = Idx2;
  if (0xf < Level) {
    __assert_fail("Idx < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x20c,"t &idx2::stack_array<int, 16>::operator[](int) const [t = int, N = 16]");
  }
  uVar6 = (ulong)(Idx2->BricksPerChunk).Arr[(int)Level];
  if (uVar6 == 0) {
    local_6f9 = 0xff;
  }
  else {
    lVar2 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    local_6f9 = 0x3f - ((byte)lVar2 ^ 0x3f);
  }
  local_5a0 = ((long)Level << 0x3c) +
              (local_308 >> (local_6f9 + (uVar6 != 1L << (local_6f9 & 0x3f)) & 0x3f)) * 0x40000 +
              (long)((int)Subband << 0xc) + ((long)BitPlane & 0xfffU);
  local_2f0 = (long *)ChunkAddress;
  local_2f8 = &local_5a0;
  if (*(long *)(ChunkAddress + 0x20) <= *(long *)(ChunkAddress + 0x18)) {
    GrowCapacity<unsigned_long>((array<unsigned_long> *)ChunkAddress,0);
  }
  lVar2 = *local_2f8;
  lVar3 = local_2f0[3];
  local_2f0[3] = lVar3 + 1;
  *(long *)(*local_2f0 + lVar3 * 8) = lVar2;
  local_3e0 = &E->ChunkStream;
  (E->ChunkStream).BitPtr = (local_3e0->Stream).Data;
  (E->ChunkStream).BitPos = 0;
  (E->ChunkStream).BitBuf = 0;
  scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Write.cpp:272:3)>
  ::~scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Write_cpp:272:3)>
                  *)local_4b8);
  return;
}

Assistant:

void
WriteChunk(const idx2_file& Idx2, encode_data* E, channel* C, i8 Level, i8 Subband, i16 BitPlane)
{
#if VISUS_IDX2
  if (Idx2.external_write)
  {
    BrickDeltasStat.Add((f64)Size(C->BrickDeltasStream)); // brick deltas
    BrickSizesStat.Add((f64)Size(C->BrickSizeStream));      // brick sizes
    i64 ChunkSize =
      Size(C->BrickDeltasStream) + Size(C->BrickSizeStream) + Size(C->BrickStream) + 64;
    Rewind(&E->ChunkStream);
    GrowToAccomodate(&E->ChunkStream, ChunkSize);
    WriteVarByte(&E->ChunkStream, C->NBricks);
    WriteStream(&E->ChunkStream, &C->BrickDeltasStream);
    WriteStream(&E->ChunkStream, &C->BrickSizeStream);
    WriteStream(&E->ChunkStream, &C->BrickStream);
    Flush(&E->ChunkStream);
    BitPlaneChunksStat.Add((f64)Size(E->ChunkStream));

    /* we are done with these, rewind */
    Rewind(&C->BrickDeltasStream);
    Rewind(&C->BrickSizeStream);
    Rewind(&C->BrickStream);

    u64 ChunkAddress = GetChunkAddress(Idx2, C->LastBrick, Level, Subband, BitPlane);
    buffer Buf = ToBuffer(E->ChunkStream);
    if (!Idx2.external_write(Idx2, Buf, ChunkAddress))
      idx2_ExitIf(true, "Write chunk failed\n");
    Rewind(&E->ChunkStream);
    return;
  }
#endif

  BrickDeltasStat.Add((f64)Size(C->BrickDeltasStream)); // brick deltas
  BrickSizesStat.Add((f64)Size(C->BrickSizeStream));       // brick sizes
  i64 ChunkSize = Size(C->BrickDeltasStream) + Size(C->BrickSizeStream) + Size(C->BrickStream) + 64;
  Rewind(&E->ChunkStream);
  GrowToAccomodate(&E->ChunkStream, ChunkSize);
  WriteVarByte(&E->ChunkStream, C->NBricks);
  WriteStream(&E->ChunkStream, &C->BrickDeltasStream);
  WriteStream(&E->ChunkStream, &C->BrickSizeStream);
  WriteStream(&E->ChunkStream, &C->BrickStream);
  Flush(&E->ChunkStream);
  BitPlaneChunksStat.Add((f64)Size(E->ChunkStream));

  /* we are done with these, rewind */
  Rewind(&C->BrickDeltasStream);
  Rewind(&C->BrickSizeStream);
  Rewind(&C->BrickStream);

  /* write to file */
  file_id FileId = ConstructFilePath(Idx2, C->LastBrick, Level, Subband, BitPlane);
  idx2_OpenMaybeExistingFile(Fp, FileId.Name.ConstPtr, "ab");
  WriteBuffer(Fp, ToBuffer(E->ChunkStream));
  /* keep track of the chunk addresses and sizes */
  auto ChunkMetaIt = Lookup(E->ChunkMeta, FileId.Id);
  if (!ChunkMetaIt)
  {
    chunk_meta_info Cm;
    InitWrite(&Cm.Sizes, 128);
    Insert(&ChunkMetaIt, FileId.Id, Cm);
  }
  idx2_Assert(ChunkMetaIt);
  chunk_meta_info* ChunkMeta = ChunkMetaIt.Val;
  GrowToAccomodate(&ChunkMeta->Sizes, 4);
  // Write the size of the chunk stream
  WriteVarByte(&ChunkMeta->Sizes, Size(E->ChunkStream));
  u64 ChunkAddress = GetChunkAddress(Idx2, C->LastBrick, Level, Subband, BitPlane);
  PushBack(&ChunkMeta->Addrs, ChunkAddress);
  Rewind(&E->ChunkStream);
}